

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O0

int Cut_CellTableLookup(Cut_CMan_t *p,Cut_Cell_t *pCell)

{
  int iVar1;
  uint uVar2;
  Cut_Cell_t *pCStack_30;
  uint Hash;
  Cut_Cell_t *pTemp;
  Cut_Cell_t **pSlot;
  Cut_Cell_t *pCell_local;
  Cut_CMan_t *p_local;
  
  pSlot = &pCell->pNext;
  pCell_local = (Cut_Cell_t *)p;
  iVar1 = Extra_TruthWordNum(*(uint *)&pCell->field_0x20 & 0xf);
  uVar2 = Extra_TruthHash(pCell->uTruth,iVar1);
  iVar1 = st__find_or_add((st__table *)pCell_local->pNextVar,(char *)(ulong)uVar2,(char ***)&pTemp);
  if (iVar1 == 0) {
    pTemp->pNext = (Cut_Cell_t *)0x0;
  }
  pCStack_30 = pTemp->pNext;
  while( true ) {
    if (pCStack_30 == (Cut_Cell_t *)0x0) {
      *pSlot = pTemp->pNext;
      pTemp->pNext = (Cut_Cell_t *)pSlot;
      pSlot[1] = *(Cut_Cell_t **)(pCell_local->Box + (ulong)(*(uint *)(pSlot + 4) & 0xf) * 8 + -0xc)
      ;
      *(Cut_Cell_t ***)(pCell_local->Box + (ulong)(*(uint *)(pSlot + 4) & 0xf) * 8 + -0xc) = pSlot;
      return 0;
    }
    if (((*(uint *)&pCStack_30->field_0x20 & 0xf) == (*(uint *)(pSlot + 4) & 0xf)) &&
       (iVar1 = Extra_TruthIsEqual(pCStack_30->uTruth,(uint *)((long)pSlot + 0x54),
                                   *(uint *)(pSlot + 4) & 0xf), iVar1 != 0)) break;
    pCStack_30 = pCStack_30->pNext;
  }
  return 1;
}

Assistant:

int Cut_CellTableLookup( Cut_CMan_t * p, Cut_Cell_t * pCell )
{
    Cut_Cell_t ** pSlot, * pTemp;
    unsigned Hash;
    Hash = Extra_TruthHash( pCell->uTruth, Extra_TruthWordNum( pCell->nVars ) );
    if ( ! st__find_or_add( p->tTable, (char *)(ABC_PTRUINT_T)Hash, (char ***)&pSlot ) )
        *pSlot = NULL;
    for ( pTemp = *pSlot; pTemp; pTemp = pTemp->pNext )
    {
        if ( pTemp->nVars != pCell->nVars )
            continue;
        if ( Extra_TruthIsEqual(pTemp->uTruth, pCell->uTruth, pCell->nVars) )
            return 1;
    }
    // the entry is new
    pCell->pNext = *pSlot;
    *pSlot = pCell;
    // add it to the variable support list
    pCell->pNextVar = p->pSameVar[pCell->nVars];
    p->pSameVar[pCell->nVars] = pCell;
    return 0;
}